

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O1

EVaction old_EVassoc_terminal_action
                   (CManager cm,EVstone stone,CMFormatList format_list,EVSimpleHandlerFunc handler,
                   void *client_data)

{
  FMFieldList list;
  int iVar1;
  EVaction EVar2;
  CMFormatList pCVar3;
  FMStructDescList format_list_00;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar6 = (ulong)(uint)stone;
  uVar7 = 0;
  for (pCVar3 = format_list;
      (format_list != (CMFormatList)0x0 && (pCVar3->format_name != (char *)0x0));
      pCVar3 = pCVar3 + 1) {
    uVar7 = uVar7 + 1;
  }
  uVar4 = (ulong)uVar7;
  format_list_00 = (FMStructDescList)INT_CMmalloc(uVar4 * 0x20 + 0x20);
  if (uVar7 != 0) {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&format_list_00->format_name + lVar5 * 2) =
           *(undefined8 *)((long)&format_list->format_name + lVar5);
      list = *(FMFieldList *)((long)&format_list->field_list + lVar5);
      *(FMFieldList *)((long)&format_list_00->field_list + lVar5 * 2) = list;
      iVar1 = struct_size_field_list(list,(int)uVar6);
      *(int *)((long)&format_list_00->struct_size + lVar5 * 2) = iVar1;
      *(undefined8 *)((long)&format_list_00->opt_info + lVar5 * 2) = 0;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 << 4 != lVar5);
  }
  format_list_00[uVar4].format_name = (char *)0x0;
  format_list_00[uVar4].field_list = (FMFieldList)0x0;
  EVar2 = EVassoc_terminal_action(cm,stone,format_list_00,handler,client_data);
  return EVar2;
}

Assistant:

extern EVaction
old_EVassoc_terminal_action(CManager cm, EVstone stone, CMFormatList format_list, 
			EVSimpleHandlerFunc handler, void* client_data)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVassoc_terminal_action(cm, stone, structs, handler, client_data);
}